

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O2

void __thiscall
phmap::priv::anon_unknown_0::Nodes_ExtractInsert_Test::TestBody(Nodes_ExtractInsert_Test *this)

{
  tuple<unsigned_long,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  *this_00;
  uint uVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  bool bVar18;
  uint uVar19;
  size_t sVar20;
  undefined8 extraout_RAX;
  size_t sVar21;
  size_t in_RCX;
  iterator *piVar22;
  iterator *value;
  iterator *value_00;
  undefined1 uVar23;
  char *pcVar24;
  ulong uVar25;
  ctrl_t *pcVar26;
  pointer *__ptr;
  hasher *in_R8;
  key_equal *in_R9;
  long lVar27;
  anon_union_8_1_a8a14541_for_iterator_1 __return_storage_ptr__;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  iVar35;
  const_iterator position;
  AssertionResult gtest_ar_6;
  AssertHelper local_2b8 [2];
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar;
  undefined1 local_278 [80];
  StringTable t;
  StringTable t2;
  node_type node;
  insert_return_type res;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  char k2 [27];
  char k1 [27];
  char k0 [28];
  __m128i match;
  char cVar28;
  char cVar32;
  char cVar33;
  char cVar34;
  
  builtin_strncpy(k0 + 0x10,"tring zero.",0xc);
  builtin_strncpy(k0,"Very long std::s",0x10);
  builtin_strncpy(k1 + 0x10,"tring one.",0xb);
  builtin_strncpy(k1,"Very long std::s",0x10);
  builtin_strncpy(k2 + 0x10,"tring two.",0xb);
  builtin_strncpy(k2,"Very long std::s",0x10);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[28],_const_char_(&)[1],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&res,&k0,(char (*) [1])0x179e98);
  local_278._0_8_ = k1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[27],_const_char_(&)[1],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(res.node.
                 super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                 .slot_space_.data + 0x20),(char (*) [27])local_278._0_8_,(char (*) [1])0x179e98);
  pcVar24 = "";
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[27],_const_char_(&)[1],_true>(&local_f8,&k2,(char (*) [1])0x179e98);
  iVar35._M_len = 3;
  iVar35._M_array = (iterator)&res;
  StringTable::raw_hash_set(&t,iVar35,in_RCX,in_R8,in_R9,(allocator_type *)gtest_ar_6._0_8_);
  lVar27 = 0x80;
  do {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(res.node.
                super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                .slot_space_.data + lVar27 + -0x20));
    lVar27 = lVar27 + -0x40;
  } while (lVar27 != -0x40);
  res.position.field_1.slot_ = (slot_type *)0x179e98;
  res.node.
  super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ._0_8_ = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
  res.node.
  super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  .slot_space_.data._8_8_ = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
  res.position.ctrl_ = (ctrl_t *)k2;
  res._16_8_ = local_278._0_8_;
  res.node.
  super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  .slot_space_.data._0_8_ = &k0;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>>>
  ::operator()(&gtest_ar,(char *)&res,(StringTable *)0x17a1f7);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&res);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar24 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&node,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6c4,pcVar24);
    testing::internal::AssertHelper::operator=((AssertHelper *)&node,(Message *)&res);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&node);
    if (res.position.ctrl_ != (ctrl_t *)0x0) {
      (**(code **)(*(long *)res.position.ctrl_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::extract<char[28],_0>
            (&node,&t.
                    super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
             ,&k0);
  pcVar24 = "";
  res.position.field_1.slot_ = (slot_type *)0x179e98;
  res.node.
  super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ._0_8_ = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
  res.position.ctrl_ = (ctrl_t *)k2;
  res._16_8_ = local_278._0_8_;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>>>
  ::operator()(&gtest_ar,(char *)&res,(StringTable *)0x17a1f7);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&res);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar24 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&t2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6c7,pcVar24);
    testing::internal::AssertHelper::operator=((AssertHelper *)&t2,(Message *)&res);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&t2);
    if (res.position.ctrl_ != (ctrl_t *)0x0) {
      (**(code **)(*(long *)res.position.ctrl_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (node.
      super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
      .alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
      super__Optional_payload<std::allocator<int>,_true,_false,_false>.
      super__Optional_payload_base<std::allocator<int>_>._M_engaged == false) {
    testing::Message::Message((Message *)&t2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&res,(internal *)&gtest_ar,(AssertionResult *)0x171b58,"false","true",
               (char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6c8,res.position.ctrl_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&t2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    std::__cxx11::string::~string((string *)&res);
    if (t2.
        super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
        .ctrl_ != (ctrl_t *)0x0) {
      (**(code **)(*(long *)t2.
                            super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                            .ctrl_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_ar.success_ =
       node.
       super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
       .alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
       super__Optional_payload<std::allocator<int>,_true,_false,_false>.
       super__Optional_payload_base<std::allocator<int>_>._M_engaged;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (node.
      super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
      .alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
      super__Optional_payload<std::allocator<int>,_true,_false,_false>.
      super__Optional_payload_base<std::allocator<int>_>._M_engaged == false) {
    testing::Message::Message((Message *)&t2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&res,(internal *)&gtest_ar,(AssertionResult *)"node.empty()","true","false"
               ,(char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6c9,res.position.ctrl_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&t2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    std::__cxx11::string::~string((string *)&res);
    if (t2.
        super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
        .ctrl_ != (ctrl_t *)0x0) {
      (**(code **)(*(long *)t2.
                            super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                            .ctrl_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  t2.
  super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  .settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (_Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
        )(_Head_base<0UL,_unsigned_long,_false>)0x0;
  t2.
  super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  .ctrl_ = (ctrl_t *)0x0;
  t2.
  super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  .slots_ = (slot_type *)0x0;
  t2.
  super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  .size_ = 0;
  t2.
  super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  .capacity_ = 0;
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::insert(&res,&t2.
                 super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
           ,&node);
  gtest_ar__2.success_ = res.inserted;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (res.inserted == false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar__2,(AssertionResult *)"res.inserted",
               "false","true",(char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6cd,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=(local_2b8,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper(local_2b8);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_6._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_6._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  pcVar24 = "";
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )((long)"%s from %s (%s ms total)\n\n" + 0x1a);
  gtest_ar__2._0_8_ = &k0;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::PairMatcher<char_const*,char_const*>>::operator()
            (&gtest_ar,&gtest_ar__2.success_,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)"*res.position");
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar24 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6ce,pcVar24);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_ar__2._0_8_ =
       CONCAT71(gtest_ar__2._1_7_,
                res.node.
                super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                .alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
                super__Optional_payload<std::allocator<int>,_true,_false,_false>.
                super__Optional_payload_base<std::allocator<int>_>._M_engaged) ^ 1;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (res.node.
      super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
      .alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
      super__Optional_payload<std::allocator<int>,_true,_false,_false>.
      super__Optional_payload_base<std::allocator<int>_>._M_engaged != false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar__2,(AssertionResult *)"res.node","true",
               "false",(char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6cf,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=(local_2b8,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper(local_2b8);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_6._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_6._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  pcVar24 = "";
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )((long)"%s from %s (%s ms total)\n\n" + 0x1a);
  gtest_ar__2._0_8_ = &k0;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>>>>
  ::operator()(&gtest_ar,&gtest_ar__2.success_,&t2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar24 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6d0,pcVar24);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  __return_storage_ptr__.slot_ = (slot_type *)&gtest_ar.message_;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)__return_storage_ptr__.slot_);
  pcVar24 = "";
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )((long)"%s from %s (%s ms total)\n\n" + 0x1a);
  local_278._8_8_ = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
  gtest_ar._0_8_ = &k2;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>>>
  ::operator()(&gtest_ar__2,&gtest_ar.success_,(StringTable *)0x17a1f7);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar24 = *(char **)gtest_ar__2.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6d3,pcVar24);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  this_00 = &t.
             super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
             .settings_;
  gtest_ar.success_ = true;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )anon_var_dwarf_58185;
  sVar20 = Hash<std::basic_string_view<char,_std::char_traits<char>_>_>::
           _hash<std::basic_string_view<char,_std::char_traits<char>_>,_0>
                     ((Hash<std::basic_string_view<char,_std::char_traits<char>_>_> *)this_00,
                      (basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar);
  if (t.
      super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
      .ctrl_ == (ctrl_t *)0x0) {
    t.
    super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
    .ctrl_ = (ctrl_t *)0x0;
  }
  else {
    auVar29._8_8_ = 0;
    auVar29._0_8_ = sVar20;
    sVar20 = SUB168(auVar29 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar29 * ZEXT816(0xde5fb9d2630458e9),0);
    __return_storage_ptr__.slot_ = (slot_type *)&gtest_ar;
    raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
    ::probe((probe_seq<16UL> *)__return_storage_ptr__.slot_,
            &t.
             super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
            ,sVar20);
    uVar23 = (undefined1)sVar20;
    auVar29 = ZEXT216(CONCAT11(uVar23,uVar23) & 0x7f7f);
    auVar29 = pshuflw(auVar29,auVar29,0);
    while( true ) {
      pcVar24 = t.
                super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                .ctrl_ + (long)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
      cVar2 = *pcVar24;
      cVar3 = pcVar24[1];
      cVar4 = pcVar24[2];
      cVar5 = pcVar24[3];
      cVar6 = pcVar24[4];
      cVar7 = pcVar24[5];
      cVar8 = pcVar24[6];
      cVar9 = pcVar24[7];
      cVar10 = pcVar24[8];
      cVar11 = pcVar24[9];
      cVar12 = pcVar24[10];
      cVar13 = pcVar24[0xb];
      cVar14 = pcVar24[0xc];
      cVar15 = pcVar24[0xd];
      cVar16 = pcVar24[0xe];
      cVar17 = pcVar24[0xf];
      cVar28 = auVar29[0];
      auVar30[0] = -(cVar28 == cVar2);
      cVar32 = auVar29[1];
      auVar30[1] = -(cVar32 == cVar3);
      cVar33 = auVar29[2];
      auVar30[2] = -(cVar33 == cVar4);
      cVar34 = auVar29[3];
      auVar30[3] = -(cVar34 == cVar5);
      auVar30[4] = -(cVar28 == cVar6);
      auVar30[5] = -(cVar32 == cVar7);
      auVar30[6] = -(cVar33 == cVar8);
      auVar30[7] = -(cVar34 == cVar9);
      auVar30[8] = -(cVar28 == cVar10);
      auVar30[9] = -(cVar32 == cVar11);
      auVar30[10] = -(cVar33 == cVar12);
      auVar30[0xb] = -(cVar34 == cVar13);
      auVar30[0xc] = -(cVar28 == cVar14);
      auVar30[0xd] = -(cVar32 == cVar15);
      auVar30[0xe] = -(cVar33 == cVar16);
      auVar30[0xf] = -(cVar34 == cVar17);
      for (uVar19 = (uint)(ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(auVar30[0xf] >> 7) << 0xf); uVar19 != 0;
          uVar19 = uVar19 - 1 & uVar19) {
        uVar1 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
          }
        }
        uVar25 = (ulong)uVar1 +
                 (long)gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl & gtest_ar._0_8_;
        __return_storage_ptr__.slot_ = (slot_type *)(uVar25 * 0x40);
        gtest_ar_6.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )t.
               super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
               .slots_[uVar25].pair.first._M_dataplus._M_p;
        gtest_ar_6._0_8_ =
             t.
             super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
             .slots_[uVar25].pair.first._M_string_length;
        gtest_ar__2.success_ = true;
        gtest_ar__2._1_7_ = 0;
        gtest_ar__2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )anon_var_dwarf_58185;
        bVar18 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            this_00,(basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_6,
                            (basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__2);
        if (bVar18) {
          pcVar26 = t.
                    super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                    .ctrl_ + uVar25;
          __return_storage_ptr__.slot_ =
               (slot_type *)
               ((long)&((__return_storage_ptr__.slot_)->pair).first._M_dataplus._M_p +
               (long)&((t.
                        super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                       .slots_)->pair).first._M_dataplus._M_p);
          goto LAB_00133db6;
        }
      }
      auVar31[0] = -(cVar2 == -0x80);
      auVar31[1] = -(cVar3 == -0x80);
      auVar31[2] = -(cVar4 == -0x80);
      auVar31[3] = -(cVar5 == -0x80);
      auVar31[4] = -(cVar6 == -0x80);
      auVar31[5] = -(cVar7 == -0x80);
      auVar31[6] = -(cVar8 == -0x80);
      auVar31[7] = -(cVar9 == -0x80);
      auVar31[8] = -(cVar10 == -0x80);
      auVar31[9] = -(cVar11 == -0x80);
      auVar31[10] = -(cVar12 == -0x80);
      auVar31[0xb] = -(cVar13 == -0x80);
      auVar31[0xc] = -(cVar14 == -0x80);
      auVar31[0xd] = -(cVar15 == -0x80);
      auVar31[0xe] = -(cVar16 == -0x80);
      auVar31[0xf] = -(cVar17 == -0x80);
      if ((((((((((((((((auVar31 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar31 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar31 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar31 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar31 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar31 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar31 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar31 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar31 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar31 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar31 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar31 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar17 == -0x80)
      break;
      local_278._0_8_ = local_278._0_8_ + 0x10;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )((ulong)(local_278._0_8_ +
                     (long)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl) & gtest_ar._0_8_);
    }
  }
  pcVar26 = t.
            super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
            .ctrl_ + t.
                     super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                     .capacity_;
LAB_00133db6:
  if (pcVar26 ==
      t.
      super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
      .ctrl_ + t.
               super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
               .capacity_) {
    gtest_ar._1_1_ = 0;
  }
  else {
    position.inner_.field_1.slot_ = __return_storage_ptr__.slot_;
    position.inner_.ctrl_ = pcVar26;
    raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
    ::extract((node_type *)&gtest_ar,
              &t.
               super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
              ,position);
  }
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::operator=(&node.
               super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
              ,(node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                *)&gtest_ar);
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::~node_handle_base((node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                       *)&gtest_ar);
  pcVar24 = "";
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )((long)"%s from %s (%s ms total)\n\n" + 0x1a);
  local_278._8_8_ = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
  gtest_ar._0_8_ = k2;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>>>
  ::operator()(&gtest_ar__2,&gtest_ar.success_,(StringTable *)0x17a1f7);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar24 = *(char **)gtest_ar__2.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6d5,pcVar24);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  gtest_ar__2._0_8_ =
       CONCAT71(gtest_ar__2._1_7_,
                node.
                super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                .alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
                super__Optional_payload<std::allocator<int>,_true,_false,_false>.
                super__Optional_payload_base<std::allocator<int>_>._M_engaged) ^ 1;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (node.
      super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
      .alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
      super__Optional_payload<std::allocator<int>,_true,_false,_false>.
      super__Optional_payload_base<std::allocator<int>_>._M_engaged != false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar__2,(AssertionResult *)0x171b58,"true",
               "false",(char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6d6,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=(local_2b8,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper(local_2b8);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_6._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_6._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::insert((insert_return_type *)&gtest_ar,
           &t2.
            super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
           ,&node);
  InsertReturnType<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>::iterator,_phmap::priv::node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>_>
  ::operator=(&res,(InsertReturnType<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>::iterator,_phmap::priv::node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>_>
                    *)&gtest_ar);
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::~node_handle_base((node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                       *)(local_278 + 8));
  piVar22 = (iterator *)(CONCAT71((int7)((ulong)extraout_RAX >> 8),res.inserted) & 0xffffffff ^ 1);
  gtest_ar__2.success_ = SUB81(piVar22,0);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (res.inserted != false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar__2,(AssertionResult *)"res.inserted","true"
               ,"false",(char *)in_R9);
    piVar22 = (iterator *)0x6da;
    testing::internal::AssertHelper::AssertHelper
              (local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6da,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=(local_2b8,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper(local_2b8);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_6._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_6._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  local_2b8[0].data_ =
       (AssertHelperData *)
       (t2.
        super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
        .ctrl_ + t2.
                 super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                 .capacity_);
  if ((AssertHelperData *)res.position.ctrl_ == local_2b8[0].data_) {
    testing::AssertionSuccess();
  }
  else {
    testing::internal::
    FormatForComparisonFailureMessage<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>::iterator,phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>::iterator>
              ((string *)&gtest_ar,(internal *)&res,value,piVar22);
    testing::internal::
    FormatForComparisonFailureMessage<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>::iterator,phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>::iterator>
              ((string *)&gtest_ar__2,(internal *)local_2b8,value_00,piVar22);
    in_R9 = (key_equal *)0x0;
    testing::internal::EqFailure
              ((internal *)&gtest_ar_6,"res.position","t2.end()",(string *)&gtest_ar,
               (string *)&gtest_ar__2,false);
    std::__cxx11::string::~string((string *)&gtest_ar__2);
    std::__cxx11::string::~string((string *)&gtest_ar);
  }
  if (gtest_ar_6.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_6.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar24 = "";
    }
    else {
      pcVar24 = *(char **)gtest_ar_6.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6db,pcVar24);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_6.message_);
  gtest_ar__2._0_8_ =
       CONCAT71(gtest_ar__2._1_7_,
                res.node.
                super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                .alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
                super__Optional_payload<std::allocator<int>,_true,_false,_false>.
                super__Optional_payload_base<std::allocator<int>_>._M_engaged) ^ 1;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (res.node.
      super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
      .alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
      super__Optional_payload<std::allocator<int>,_true,_false,_false>.
      super__Optional_payload_base<std::allocator<int>_>._M_engaged != false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar__2,(AssertionResult *)"res.node","true",
               "false",(char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6dc,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=(local_2b8,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper(local_2b8);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_6._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_6._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  pcVar24 = "";
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )((long)"%s from %s (%s ms total)\n\n" + 0x1a);
  gtest_ar__2._0_8_ = k0;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>>>>
  ::operator()(&gtest_ar,&gtest_ar__2.success_,&t2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar24 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6dd,pcVar24);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_ar._0_8_ = strlen(k0);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )k0;
  sVar20 = raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>
           ::hash<std::basic_string_view<char,std::char_traits<char>>>
                     ((raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>
                       *)&t,(basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar);
  sVar21 = raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>
           ::_find_key<std::basic_string_view<char,std::char_traits<char>>>
                     ((raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>
                       *)&t,(basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar,sVar20);
  if (sVar21 == 0xffffffffffffffff) {
    sVar21 = raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
             ::prepare_insert(&t.
                               super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                              ,sVar20);
    gtest_ar_6._0_8_ = (long)"15 * 2 + 1" + 9;
    gtest_ar__2._0_8_ = k0;
    std::pair<std::__cxx11::string,std::__cxx11::string>::
    pair<char_const(&)[28],0ul,char_const(&)[2],0ul>
              ((pair<std::__cxx11::string,std::__cxx11::string> *)
               (t.
                super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                .slots_ + sVar21));
    raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
    ::set_ctrl(&t.
                super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
               ,sVar21,(byte)sVar20 & 0x7f);
  }
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::extract<char[28],_0>
            ((node_type *)&gtest_ar,
             &t.
              super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
             ,&k0);
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::operator=(&node.
               super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
              ,(node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                *)&gtest_ar);
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::~node_handle_base((node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                       *)&gtest_ar);
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::insert((insert_return_type *)&gtest_ar,
           &t2.
            super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
           ,(node_type *)
            &node.
             super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
          );
  InsertReturnType<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>::iterator,_phmap::priv::node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>_>
  ::operator=(&res,(InsertReturnType<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>::iterator,_phmap::priv::node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>_>
                    *)&gtest_ar);
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::~node_handle_base((node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                       *)(local_278 + 8));
  gtest_ar__2._0_8_ = CONCAT71(gtest_ar__2._1_7_,res.inserted) ^ 1;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (res.inserted != false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar__2,(AssertionResult *)"res.inserted","true"
               ,"false",(char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6e4,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=(local_2b8,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper(local_2b8);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_6._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_6._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  pcVar24 = "";
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )((long)"%s from %s (%s ms total)\n\n" + 0x1a);
  gtest_ar__2._0_8_ = &k0;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::PairMatcher<char_const*,char_const*>>::operator()
            (&gtest_ar,&gtest_ar__2.success_,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)"*res.position");
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar24 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6e5,pcVar24);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_ar__2.success_ =
       res.node.
       super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
       .alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
       super__Optional_payload<std::allocator<int>,_true,_false,_false>.
       super__Optional_payload_base<std::allocator<int>_>._M_engaged;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (res.node.
      super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
      .alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
      super__Optional_payload<std::allocator<int>,_true,_false,_false>.
      super__Optional_payload_base<std::allocator<int>_>._M_engaged == false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar__2,(AssertionResult *)"res.node","false",
               "true",(char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6e6,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=(local_2b8,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper(local_2b8);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_6._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_6._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  gtest_ar__2._0_8_ =
       CONCAT71(gtest_ar__2._1_7_,
                node.
                super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                .alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
                super__Optional_payload<std::allocator<int>,_true,_false,_false>.
                super__Optional_payload_base<std::allocator<int>_>._M_engaged) ^ 1;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (node.
      super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
      .alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
      super__Optional_payload<std::allocator<int>,_true,_false,_false>.
      super__Optional_payload_base<std::allocator<int>_>._M_engaged == true) {
    testing::Message::Message((Message *)&gtest_ar_6);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar__2,(AssertionResult *)0x171b58,"true",
               "false",(char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6e7,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=(local_2b8,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper(local_2b8);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_6._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_6._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::~node_handle_base(&res.node.
                       super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                     );
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::~raw_hash_set(&t2.
                   super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                 );
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::~node_handle_base(&node.
                       super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                     );
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::~raw_hash_set(&t.
                   super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                 );
  return;
}

Assistant:

TEST(Nodes, ExtractInsert) {
  constexpr char k0[] = "Very long std::string zero.";
  constexpr char k1[] = "Very long std::string one.";
  constexpr char k2[] = "Very long std::string two.";
  StringTable t = {{k0, ""}, {k1, ""}, {k2, ""}};
  EXPECT_THAT(t,
              UnorderedElementsAre(Pair(k0, ""), Pair(k1, ""), Pair(k2, "")));

  auto node = t.extract(k0);
  EXPECT_THAT(t, UnorderedElementsAre(Pair(k1, ""), Pair(k2, "")));
  EXPECT_TRUE(node);
  EXPECT_FALSE(node.empty());

  StringTable t2;
  StringTable::insert_return_type res = t2.insert(std::move(node));
  EXPECT_TRUE(res.inserted);
  EXPECT_THAT(*res.position, Pair(k0, ""));
  EXPECT_FALSE(res.node);
  EXPECT_THAT(t2, UnorderedElementsAre(Pair(k0, "")));

  // Not there.
  EXPECT_THAT(t, UnorderedElementsAre(Pair(k1, ""), Pair(k2, "")));
  node = t.extract("Not there!");
  EXPECT_THAT(t, UnorderedElementsAre(Pair(k1, ""), Pair(k2, "")));
  EXPECT_FALSE(node);

  // Inserting nothing.
  res = t2.insert(std::move(node));
  EXPECT_FALSE(res.inserted);
  EXPECT_EQ(res.position, t2.end());
  EXPECT_FALSE(res.node);
  EXPECT_THAT(t2, UnorderedElementsAre(Pair(k0, "")));

  t.emplace(k0, "1");
  node = t.extract(k0);

  // Insert duplicate.
  res = t2.insert(std::move(node));
  EXPECT_FALSE(res.inserted);
  EXPECT_THAT(*res.position, Pair(k0, ""));
  EXPECT_TRUE(res.node);
  EXPECT_FALSE(node);
}